

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O2

void __thiscall hmi::renderer::draw(renderer *this,vertex *vertices,size_t count,int primitive)

{
  GLint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  vec2i vVar4;
  ostream *poVar5;
  mat3f transform;
  
  vVar4 = get_size(this);
  (*glad_glViewport)(0,0,vVar4.field_0._0_4_,vVar4.field_0._4_4_);
  get_view_matrix(&transform,this);
  GVar1 = (*glad_glGetUniformLocation)(this->m_program,"u_transform");
  if (GVar1 == -1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Uniform not found");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    (*glad_glUniformMatrix3fv)(GVar1,1,'\0',(GLfloat *)&transform);
    (*glad_glUseProgram)(this->m_program);
    GVar2 = (*glad_glGetAttribLocation)(this->m_program,"a_position");
    GVar3 = (*glad_glGetAttribLocation)(this->m_program,"a_color");
    (*glad_glEnableVertexAttribArray)(GVar2);
    (*glad_glEnableVertexAttribArray)(GVar3);
    (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',0x18,vertices);
    (*glad_glVertexAttribPointer)(GVar3,4,0x1406,'\0',0x18,&vertices->color);
    (*glad_glDrawArrays)(primitive,0,(GLsizei)count);
    (*glad_glDisableVertexAttribArray)(GVar2);
    (*glad_glDisableVertexAttribArray)(GVar3);
  }
  return;
}

Assistant:

void renderer::draw(const vertex *vertices, std::size_t count, int primitive) {
    // set viewport

    vec2i size = get_size();
    glViewport(0, 0, size.width, size.height);

    // set transformation matrix

    mat3f transform = get_view_matrix();

    GLint loc = glGetUniformLocation(m_program, "u_transform");

    if (loc == -1) {
      std::cerr << "Uniform not found" << std::endl;
      return;
    }

    glUniformMatrix3fv(loc, 1, GL_FALSE, &transform.data[0][0]);

    // send data

    glUseProgram(m_program);

    GLint position_loc = glGetAttribLocation(m_program, "a_position");

    if (loc == -1) {
      std::cerr << "Attribute not found: a_position" << std::endl;
      return;
    }

    GLint color_loc = glGetAttribLocation(m_program, "a_color");

    if (loc == -1) {
      std::cerr << "Attribute not found: a_color" << std::endl;
      return;
    }

    glEnableVertexAttribArray(position_loc);
    glEnableVertexAttribArray(color_loc);

    const void *position_pointer = &vertices[0].position;
    const void *color_pointer = &vertices[0].color;

    glVertexAttribPointer(position_loc, 2, GL_FLOAT, GL_FALSE, sizeof(vertex), position_pointer);
    glVertexAttribPointer(color_loc, 4, GL_FLOAT, GL_FALSE, sizeof(vertex), color_pointer);

    glDrawArrays(primitive, 0, count);

    glDisableVertexAttribArray(position_loc);
    glDisableVertexAttribArray(color_loc);
  }